

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O2

bool __thiscall Assimp::Q3BSPFileParser::readData(Q3BSPFileParser *this,string *rMapName)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  size_type __new_size;
  size_type sVar4;
  undefined4 extraout_var;
  
  iVar2 = (*(this->m_pZipArchive->super_IOSystem)._vptr_IOSystem[2])
                    (this->m_pZipArchive,(rMapName->_M_dataplus)._M_p);
  if ((char)iVar2 != '\0') {
    iVar2 = (*(this->m_pZipArchive->super_IOSystem)._vptr_IOSystem[4])
                      (this->m_pZipArchive,(rMapName->_M_dataplus)._M_p,"rb");
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 != (long *)0x0) {
      __new_size = (**(code **)(*plVar3 + 0x30))(plVar3);
      std::vector<char,_std::allocator<char>_>::resize(&this->m_Data,__new_size);
      sVar4 = (**(code **)(*plVar3 + 0x10))
                        (plVar3,(this->m_Data).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_start,1,__new_size);
      if ((sVar4 != __new_size) &&
         (pcVar1 = (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish != pcVar1)) {
        (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar1;
      }
      (*(this->m_pZipArchive->super_IOSystem)._vptr_IOSystem[5])(this->m_pZipArchive,plVar3);
      return sVar4 == __new_size;
    }
  }
  return false;
}

Assistant:

bool Q3BSPFileParser::readData( const std::string &rMapName ) {
    if ( !m_pZipArchive->Exists( rMapName.c_str() ) )
        return false;

    IOStream *pMapFile = m_pZipArchive->Open( rMapName.c_str() );
    if ( nullptr == pMapFile )
        return false;

    const size_t size = pMapFile->FileSize();
    m_Data.resize( size );

    const size_t readSize = pMapFile->Read( &m_Data[0], sizeof( char ), size );
    if ( readSize != size ) {
        m_Data.clear();
        m_pZipArchive->Close(pMapFile);
        return false;
    }
    m_pZipArchive->Close( pMapFile );

    return true;
}